

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiAgentDecisionProcessDiscreteFactoredStates.cpp
# Opt level: O0

void __thiscall
MultiAgentDecisionProcessDiscreteFactoredStates::RemoveStateFactor
          (MultiAgentDecisionProcessDiscreteFactoredStates *this,Index sf)

{
  bool bVar1;
  int iVar2;
  Index IVar3;
  Index IVar4;
  ulong uVar5;
  CPDDiscreteInterface *pCVar6;
  undefined4 extraout_var;
  reference ppCVar7;
  size_type sVar8;
  reference pvVar9;
  value_type vVar10;
  reference pvVar11;
  ulong uVar12;
  TwoStageDynamicBayesianNetwork *this_00;
  Scope *ASoI;
  uint in_ESI;
  long *in_RDI;
  size_t i_3;
  size_t i_2;
  Scope sc_2;
  Index x_2;
  Scope YSc_2;
  Scope XSc_2;
  Scope sc_1;
  Index x_1;
  Scope YSc_1;
  Scope XSc_1;
  CPT *cpt;
  size_t nrVals_i;
  size_t j_2;
  size_t j_1;
  size_t j;
  vector<unsigned_long,_std::allocator<unsigned_long>_> size_YScI_r;
  vector<unsigned_long,_std::allocator<unsigned_long>_> size_ASc_i_sf;
  vector<unsigned_long,_std::allocator<unsigned_long>_> size_XSc_i_sf;
  size_t ii_size;
  Scope YScI_r;
  Scope ASc_i_sf;
  Scope XSc_i_sf;
  Scope iSc;
  Scope sfSc;
  Scope YScI;
  size_t i_1;
  Scope sc;
  Index x;
  Scope YSc;
  Scope XSc;
  size_t i;
  vector<Scope,_std::allocator<Scope>_> OSoIO;
  vector<Scope,_std::allocator<Scope>_> YSoIO;
  vector<Scope,_std::allocator<Scope>_> ASoIO;
  vector<Scope,_std::allocator<Scope>_> XSoIO;
  vector<Scope,_std::allocator<Scope>_> YSoIY;
  vector<Scope,_std::allocator<Scope>_> ASoIY;
  vector<Scope,_std::allocator<Scope>_> XSoIY;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> O_cpts;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> Y_cpts;
  Scope XScSf;
  undefined4 in_stack_fffffffffffffa98;
  Index in_stack_fffffffffffffa9c;
  TwoStageDynamicBayesianNetwork *in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa8;
  Index in_stack_fffffffffffffaac;
  TwoStageDynamicBayesianNetwork *in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab8;
  Index in_stack_fffffffffffffabc;
  Scope *in_stack_fffffffffffffac0;
  size_t in_stack_fffffffffffffad0;
  Scope *YSoI;
  Scope *in_stack_fffffffffffffad8;
  CPT *in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae8;
  Index in_stack_fffffffffffffaec;
  TwoStageDynamicBayesianNetwork *in_stack_fffffffffffffaf0;
  Scope *in_stack_fffffffffffffb28;
  undefined6 in_stack_fffffffffffffb30;
  undefined1 in_stack_fffffffffffffb36;
  undefined1 in_stack_fffffffffffffb37;
  TwoStageDynamicBayesianNetwork *in_stack_fffffffffffffb50;
  Scope *local_368;
  size_type local_360;
  uint local_33c;
  uint local_2e4;
  ulong local_298;
  ulong local_290;
  ulong local_288;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_270;
  undefined8 local_250;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_248;
  undefined8 local_228;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_220;
  long local_208;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_200;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1d0 [4];
  ulong local_170;
  uint local_14c;
  ulong local_118;
  vector<Scope,_std::allocator<Scope>_> local_110;
  vector<Scope,_std::allocator<Scope>_> local_f8;
  vector<Scope,_std::allocator<Scope>_> local_e0;
  vector<Scope,_std::allocator<Scope>_> local_c8;
  vector<Scope,_std::allocator<Scope>_> local_b0;
  vector<Scope,_std::allocator<Scope>_> local_98;
  vector<Scope,_std::allocator<Scope>_> local_80;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> local_58;
  vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> local_40 [2];
  uint local_c;
  
  local_c = in_ESI;
  TwoStageDynamicBayesianNetwork::GetXSoI_Y(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
  Scope::Scope((Scope *)in_stack_fffffffffffffaa0,
               (Scope *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::vector
            ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)0xaeb226);
  (**(code **)(*in_RDI + 0x10))();
  std::allocator<CPDDiscreteInterface_*>::allocator((allocator<CPDDiscreteInterface_*> *)0xaeb256);
  std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::vector
            ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
             in_stack_fffffffffffffac0,CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8)
             ,(allocator_type *)in_stack_fffffffffffffab0);
  std::allocator<CPDDiscreteInterface_*>::~allocator((allocator<CPDDiscreteInterface_*> *)0xaeb282);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaeb28f);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaeb29c);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaeb2a9);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaeb2b6);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaeb2c3);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaeb2d0);
  std::vector<Scope,_std::allocator<Scope>_>::vector
            ((vector<Scope,_std::allocator<Scope>_> *)0xaeb2dd);
  for (local_118 = 0; uVar12 = local_118, uVar5 = (**(code **)(*in_RDI + 0x10))(), uVar12 < uVar5;
      local_118 = local_118 + 1) {
    pCVar6 = TwoStageDynamicBayesianNetwork::GetCPD_O
                       (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
    iVar2 = (*pCVar6->_vptr_CPDDiscreteInterface[6])();
    ppCVar7 = std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::
              operator[](&local_58,local_118);
    *ppCVar7 = (value_type)CONCAT44(extraout_var,iVar2);
    TwoStageDynamicBayesianNetwork::GetXSoI_O(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
    Scope::Scope((Scope *)in_stack_fffffffffffffaa0,
                 (Scope *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    TwoStageDynamicBayesianNetwork::GetYSoI_O(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
    Scope::Scope((Scope *)in_stack_fffffffffffffaa0,
                 (Scope *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    local_14c = local_c;
    while( true ) {
      local_14c = local_14c + 1;
      uVar12 = (ulong)local_14c;
      uVar5 = (**(code **)(*in_RDI + 0xa8))();
      if (uVar5 <= uVar12) break;
      Scope::Scope((Scope *)in_stack_fffffffffffffaa0);
      Scope::Insert((Scope *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
      bVar1 = Scope::Contains(in_stack_fffffffffffffac0,in_stack_fffffffffffffabc);
      if (bVar1) {
        Scope::Remove((Scope *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
        Scope::Insert((Scope *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
      }
      bVar1 = Scope::Contains(in_stack_fffffffffffffac0,in_stack_fffffffffffffabc);
      if (bVar1) {
        Scope::Remove((Scope *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
        Scope::Insert((Scope *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
      }
      Scope::~Scope((Scope *)0xaeb5fa);
    }
    std::vector<Scope,_std::allocator<Scope>_>::push_back
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0,
               (value_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    TwoStageDynamicBayesianNetwork::GetASoI_O(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
    std::vector<Scope,_std::allocator<Scope>_>::push_back
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0,
               (value_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    std::vector<Scope,_std::allocator<Scope>_>::push_back
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0,
               (value_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    TwoStageDynamicBayesianNetwork::GetOSoI_O(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
    std::vector<Scope,_std::allocator<Scope>_>::push_back
              ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0,
               (value_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
    Scope::~Scope((Scope *)0xaeb6c3);
    Scope::~Scope((Scope *)0xaeb6d0);
  }
  for (local_170 = 0; uVar12 = local_170, uVar5 = (**(code **)(*in_RDI + 0xa8))(), uVar12 < uVar5;
      local_170 = local_170 + 1) {
    if (local_170 != local_c) {
      TwoStageDynamicBayesianNetwork::GetYSoI_Y(in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c)
      ;
      Scope::Scope((Scope *)in_stack_fffffffffffffaa0,
                   (Scope *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
      bVar1 = Scope::Contains(in_stack_fffffffffffffac0,in_stack_fffffffffffffabc);
      if (bVar1) {
        Scope::Scope((Scope *)in_stack_fffffffffffffaa0);
        Scope::Insert((Scope *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
        Scope::Scope((Scope *)in_stack_fffffffffffffaa0);
        Scope::Insert((Scope *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
        TwoStageDynamicBayesianNetwork::GetXSoI_Y
                  (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
        Scope::Scope((Scope *)in_stack_fffffffffffffaa0,
                     (Scope *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        Scope::Insert(in_stack_fffffffffffffac0,
                      (Scope *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        TwoStageDynamicBayesianNetwork::GetASoI_Y
                  (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
        Scope::Scope((Scope *)in_stack_fffffffffffffaa0,
                     (Scope *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        TwoStageDynamicBayesianNetwork::GetASoI_Y
                  (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
        Scope::Insert(in_stack_fffffffffffffac0,
                      (Scope *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
        Scope::Scope((Scope *)in_stack_fffffffffffffaa0,
                     (Scope *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        Scope::Remove((Scope *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
        local_208 = 1;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_1d0);
        local_228 = 0;
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xaeb962);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffac0,
                   CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (value_type_conflict2 *)in_stack_fffffffffffffab0,
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xaeb996);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_1e8);
        local_250 = 0;
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xaeb9cc);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffac0,
                   CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (value_type_conflict2 *)in_stack_fffffffffffffab0,
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xaeba00);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_200);
        std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xaeba36);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffac0,
                   CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
                   (value_type_conflict2 *)in_stack_fffffffffffffab0,
                   (allocator_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xaeba6a);
        for (local_288 = 0;
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_1d0),
            local_288 < sVar8; local_288 = local_288 + 1) {
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (local_1d0,local_288);
          vVar10 = (**(code **)(*in_RDI + 0xc0))(in_RDI,*pvVar9);
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&local_220,local_288);
          *pvVar11 = vVar10;
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&local_220,local_288);
          local_208 = *pvVar11 * local_208;
        }
        for (local_290 = 0;
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_1e8),
            local_290 < sVar8; local_290 = local_290 + 1) {
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&local_1e8,local_290);
          vVar10 = (**(code **)(*in_RDI + 0x108))(in_RDI,*pvVar9);
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&local_248,local_290);
          *pvVar11 = vVar10;
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&local_248,local_290);
          local_208 = *pvVar11 * local_208;
        }
        for (local_298 = 0;
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&local_200),
            local_298 < sVar8; local_298 = local_298 + 1) {
          pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (&local_200,local_298);
          vVar10 = (**(code **)(*in_RDI + 0xc0))(in_RDI,*pvVar9);
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&local_270,local_298);
          *pvVar11 = vVar10;
          pvVar11 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                              (&local_270,local_298);
          local_208 = *pvVar11 * local_208;
        }
        (**(code **)(*in_RDI + 0xc0))(in_RDI,local_170 & 0xffffffff);
        operator_new(0x30);
        CPT::CPT(in_stack_fffffffffffffae0,(size_t)in_stack_fffffffffffffad8,
                 in_stack_fffffffffffffad0);
        std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::push_back
                  ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
                   in_stack_fffffffffffffaa0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        Scope::Scope((Scope *)in_stack_fffffffffffffaa0,
                     (Scope *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        Scope::Scope((Scope *)in_stack_fffffffffffffaa0,
                     (Scope *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        local_2e4 = local_c;
        while( true ) {
          local_2e4 = local_2e4 + 1;
          uVar12 = (**(code **)(*in_RDI + 0xa8))();
          if (uVar12 <= local_2e4) break;
          Scope::Scope((Scope *)in_stack_fffffffffffffaa0);
          Scope::Insert((Scope *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
          bVar1 = Scope::Contains(in_stack_fffffffffffffac0,in_stack_fffffffffffffabc);
          if (bVar1) {
            Scope::Remove((Scope *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
            Scope::Insert((Scope *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
          }
          bVar1 = Scope::Contains(in_stack_fffffffffffffac0,in_stack_fffffffffffffabc);
          if (bVar1) {
            Scope::Remove((Scope *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
            Scope::Insert((Scope *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
          }
          Scope::~Scope((Scope *)0xaec09c);
        }
        std::vector<Scope,_std::allocator<Scope>_>::push_back
                  ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        std::vector<Scope,_std::allocator<Scope>_>::push_back
                  ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        std::vector<Scope,_std::allocator<Scope>_>::push_back
                  ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        Scope::~Scope((Scope *)0xaec104);
        Scope::~Scope((Scope *)0xaec111);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffab0);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffab0);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                  ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                   in_stack_fffffffffffffab0);
        Scope::~Scope((Scope *)0xaec145);
        Scope::~Scope((Scope *)0xaec152);
        Scope::~Scope((Scope *)0xaec15f);
        Scope::~Scope((Scope *)0xaec16c);
        Scope::~Scope((Scope *)0xaec179);
      }
      else {
        pCVar6 = TwoStageDynamicBayesianNetwork::GetCPD_Y
                           (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
        (*pCVar6->_vptr_CPDDiscreteInterface[6])();
        std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::push_back
                  ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
                   in_stack_fffffffffffffaa0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        in_stack_fffffffffffffb50 =
             (TwoStageDynamicBayesianNetwork *)
             TwoStageDynamicBayesianNetwork::GetXSoI_Y
                       (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
        Scope::Scope((Scope *)in_stack_fffffffffffffaa0,
                     (Scope *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        TwoStageDynamicBayesianNetwork::GetYSoI_Y
                  (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
        Scope::Scope((Scope *)in_stack_fffffffffffffaa0,
                     (Scope *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        local_33c = local_c;
        while( true ) {
          local_33c = local_33c + 1;
          uVar12 = (**(code **)(*in_RDI + 0xa8))();
          if (uVar12 <= local_33c) break;
          Scope::Scope((Scope *)in_stack_fffffffffffffaa0);
          Scope::Insert((Scope *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
          in_stack_fffffffffffffb37 =
               Scope::Contains(in_stack_fffffffffffffac0,in_stack_fffffffffffffabc);
          if ((bool)in_stack_fffffffffffffb37) {
            Scope::Remove((Scope *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
            Scope::Insert((Scope *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
          }
          in_stack_fffffffffffffb36 =
               Scope::Contains(in_stack_fffffffffffffac0,in_stack_fffffffffffffabc);
          if ((bool)in_stack_fffffffffffffb36) {
            Scope::Remove((Scope *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
            Scope::Insert((Scope *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
          }
          Scope::~Scope((Scope *)0xaec47e);
        }
        std::vector<Scope,_std::allocator<Scope>_>::push_back
                  ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        in_stack_fffffffffffffb28 =
             TwoStageDynamicBayesianNetwork::GetASoI_Y
                       (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa9c);
        std::vector<Scope,_std::allocator<Scope>_>::push_back
                  ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        std::vector<Scope,_std::allocator<Scope>_>::push_back
                  ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0,
                   (value_type *)CONCAT44(in_stack_fffffffffffffaac,in_stack_fffffffffffffaa8));
        Scope::~Scope((Scope *)0xaec50b);
        Scope::~Scope((Scope *)0xaec518);
      }
      Scope::~Scope((Scope *)0xaec543);
    }
  }
  MADPComponentFactoredStates::RemoveStateFactor
            ((MADPComponentFactoredStates *)
             CONCAT17(in_stack_fffffffffffffb37,
                      CONCAT16(in_stack_fffffffffffffb36,in_stack_fffffffffffffb30)),
             (Index)((ulong)in_stack_fffffffffffffb28 >> 0x20));
  MADPComponentFactoredStates::SetInitialized
            ((MADPComponentFactoredStates *)
             CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
             SUB81((ulong)in_stack_fffffffffffffab0 >> 0x38,0));
  MADPComponentFactoredStates::SetInitialized
            ((MADPComponentFactoredStates *)
             CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8),
             SUB81((ulong)in_stack_fffffffffffffab0 >> 0x38,0));
  TwoStageDynamicBayesianNetwork::InitializeStorage(in_stack_fffffffffffffb50);
  for (local_360 = 0; uVar12 = (**(code **)(*in_RDI + 0x10))(), local_360 < uVar12;
      local_360 = local_360 + 1) {
    in_stack_fffffffffffffaf0 = (TwoStageDynamicBayesianNetwork *)(in_RDI + 0x49);
    IVar3 = (Index)local_360;
    IVar4 = IVar3;
    this_00 = (TwoStageDynamicBayesianNetwork *)
              std::vector<Scope,_std::allocator<Scope>_>::operator[](&local_c8,local_360);
    std::vector<Scope,_std::allocator<Scope>_>::operator[](&local_e0,local_360);
    std::vector<Scope,_std::allocator<Scope>_>::operator[](&local_f8,local_360);
    std::vector<Scope,_std::allocator<Scope>_>::operator[](&local_110,local_360);
    TwoStageDynamicBayesianNetwork::SetSoI_O
              (this_00,IVar4,(Scope *)in_stack_fffffffffffffaf0,
               (Scope *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8),
               (Scope *)in_stack_fffffffffffffae0,in_stack_fffffffffffffad8);
    in_stack_fffffffffffffae0 = (CPT *)(in_RDI + 0x49);
    std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::operator[]
              (&local_58,local_360);
    TwoStageDynamicBayesianNetwork::SetCPD_O
              (in_stack_fffffffffffffab0,in_stack_fffffffffffffaac,
               (CPDDiscreteInterface *)in_stack_fffffffffffffaa0);
    in_stack_fffffffffffffaec = IVar3;
  }
  local_368 = (Scope *)0x0;
  while (YSoI = local_368, ASoI = (Scope *)(**(code **)(*in_RDI + 0xa8))(), YSoI < ASoI) {
    in_stack_fffffffffffffab0 = (TwoStageDynamicBayesianNetwork *)(in_RDI + 0x49);
    IVar4 = (Index)local_368;
    std::vector<Scope,_std::allocator<Scope>_>::operator[](&local_80,(size_type)local_368);
    std::vector<Scope,_std::allocator<Scope>_>::operator[](&local_98,(size_type)local_368);
    std::vector<Scope,_std::allocator<Scope>_>::operator[](&local_b0,(size_type)local_368);
    TwoStageDynamicBayesianNetwork::SetSoI_Y
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec,
               (Scope *)in_stack_fffffffffffffae0,ASoI,YSoI);
    pCVar6 = (CPDDiscreteInterface *)(in_RDI + 0x49);
    std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::operator[]
              (local_40,(size_type)local_368);
    TwoStageDynamicBayesianNetwork::SetCPD_Y(in_stack_fffffffffffffab0,IVar4,pCVar6);
    local_368 = (Scope *)((long)&(local_368->super_SDT).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start + 1);
  }
  TwoStageDynamicBayesianNetwork::InitializeIIs
            ((TwoStageDynamicBayesianNetwork *)
             ASc_i_sf.super_SDT.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0);
  std::vector<Scope,_std::allocator<Scope>_>::~vector
            ((vector<Scope,_std::allocator<Scope>_> *)in_stack_fffffffffffffab0);
  std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::~vector
            ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
             in_stack_fffffffffffffab0);
  std::vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_>::~vector
            ((vector<CPDDiscreteInterface_*,_std::allocator<CPDDiscreteInterface_*>_> *)
             in_stack_fffffffffffffab0);
  Scope::~Scope((Scope *)0xaec8d8);
  return;
}

Assistant:

void MultiAgentDecisionProcessDiscreteFactoredStates::RemoveStateFactor(Index sf)
{
    Scope XScSf = _m_2dbn.GetXSoI_Y(sf);
    vector<CPDDiscreteInterface*> Y_cpts;
    vector<CPDDiscreteInterface*> O_cpts(GetNrAgents());
    vector<Scope> XSoIY, ASoIY, YSoIY;
    vector<Scope> XSoIO, ASoIO, YSoIO, OSoIO;

    for(size_t i = 0; i < GetNrAgents(); i++)
    {
        O_cpts[i] = _m_2dbn.GetCPD_O(i)->Clone();
        Scope XSc(_m_2dbn.GetXSoI_O(i)), YSc(_m_2dbn.GetYSoI_O(i));
        for(Index x = sf+1; x < GetNrStateFactors(); x++){
            //This corrects the scope indices, which will be changed after removing sf
            Scope sc;
            sc.Insert(x);
            if(XSc.Contains(x)){
                XSc.Remove(sc);
                XSc.Insert(x-1);
            }
            if(YSc.Contains(x)){
                YSc.Remove(sc);
                YSc.Insert(x-1);
            }
        }
        XSoIO.push_back(XSc);
        ASoIO.push_back(_m_2dbn.GetASoI_O(i));
        YSoIO.push_back(YSc);
        OSoIO.push_back(_m_2dbn.GetOSoI_O(i));
    }

    for(size_t i = 0; i < GetNrStateFactors(); i++)
    {
        if(i == sf)
            continue;    
        Scope YScI = _m_2dbn.GetYSoI_Y(i);
        if(YScI.Contains(sf))
        {
            Scope sfSc;
            sfSc.Insert(sf);
            Scope iSc;
            iSc.Insert(i);
            Scope XSc_i_sf = _m_2dbn.GetXSoI_Y(i);
            XSc_i_sf.Insert(XScSf);
            Scope ASc_i_sf = _m_2dbn.GetASoI_Y(i);
            ASc_i_sf.Insert(_m_2dbn.GetASoI_Y(sf));
            Scope YScI_r(YScI);
            YScI_r.Remove(sfSc);

            size_t ii_size = 1;
            vector<size_t> size_XSc_i_sf(XSc_i_sf.size(),0);
            vector<size_t> size_ASc_i_sf(ASc_i_sf.size(),0);
            vector<size_t> size_YScI_r(YScI_r.size(),0);
            for(size_t j = 0; j < XSc_i_sf.size(); j++){
                size_XSc_i_sf[j] = GetNrValuesForFactor(XSc_i_sf[j]);
                ii_size *= size_XSc_i_sf[j];
            }
            for(size_t j = 0; j < ASc_i_sf.size(); j++){
                size_ASc_i_sf[j] = GetNrActions(ASc_i_sf[j]);
                ii_size *= size_ASc_i_sf[j];
            }
            for(size_t j = 0; j < YScI_r.size(); j++){
                size_YScI_r[j] = GetNrValuesForFactor(YScI_r[j]);
                ii_size *= size_YScI_r[j];
            }
            size_t nrVals_i = GetNrValuesForFactor(i);
            CPT* cpt = new CPT(nrVals_i, ii_size);

            //NOTE: This already fixes the scopes and CPT sizes in the DBN, but it does not yet marginalize
            //each CPT. This will be necessary for factored event-driven algorithms.

            Y_cpts.push_back(cpt);
            Scope XSc(XSc_i_sf), YSc(YScI_r);
            for(Index x = sf+1; x < GetNrStateFactors(); x++){
                Scope sc;
                sc.Insert(x);
                if(XSc.Contains(x)){
                    XSc.Remove(sc);
                    XSc.Insert(x-1);
                }
                if(YSc.Contains(x)){
                    YSc.Remove(sc);
                    YSc.Insert(x-1);
                }
            }
            XSoIY.push_back(XSc);
            ASoIY.push_back(ASc_i_sf);
            YSoIY.push_back(YSc);
        }
        else
        {
            Y_cpts.push_back(_m_2dbn.GetCPD_Y(i)->Clone());
            Scope XSc(_m_2dbn.GetXSoI_Y(i)), YSc(_m_2dbn.GetYSoI_Y(i));
            for(Index x = sf+1; x < GetNrStateFactors(); x++){
                Scope sc;
                sc.Insert(x);
                if(XSc.Contains(x)){
                    XSc.Remove(sc);
                    XSc.Insert(x-1);
                }
                if(YSc.Contains(x)){
                    YSc.Remove(sc);
                    YSc.Insert(x-1);
                }
            }
            XSoIY.push_back(XSc);
            ASoIY.push_back(_m_2dbn.GetASoI_Y(i));
            YSoIY.push_back(YSc);
        }
    }

    _m_S.RemoveStateFactor(sf);
    _m_S.SetInitialized(false);
    _m_S.SetInitialized(true);

    //now we need to fix the DBN
    _m_2dbn.InitializeStorage();
    for(size_t i = 0; i < GetNrAgents(); i++)
    {
        _m_2dbn.SetSoI_O(i, XSoIO[i], ASoIO[i], YSoIO[i], OSoIO[i]);
        _m_2dbn.SetCPD_O(i, O_cpts[i]);
    }
    for(size_t i = 0; i < GetNrStateFactors(); i++)
    {
        _m_2dbn.SetSoI_Y(i, XSoIY[i], ASoIY[i], YSoIY[i]);
        _m_2dbn.SetCPD_Y(i, Y_cpts[i]);
    }
    _m_2dbn.InitializeIIs();
}